

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcm.c
# Opt level: O0

void mcmcliexp(mcmcxdef *cctx,mcmon clinum)

{
  ushort in_SI;
  size_t *in_RDI;
  mcmon *p;
  int i;
  mcmcx1def *ctx;
  uchar *local_28;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  int iVar1;
  undefined6 in_stack_fffffffffffffff0;
  
  if (in_RDI[(long)((int)(uint)in_SI >> 8) + 6] == 0) {
    local_28 = mchalo((errcxdef *)CONCAT26(in_SI,in_stack_fffffffffffffff0),*in_RDI,
                      (char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
    in_RDI[(long)((int)(uint)in_SI >> 8) + 6] = (size_t)local_28;
    for (iVar1 = 0; iVar1 < 0x100; iVar1 = iVar1 + 1) {
      local_28[0] = 0xff;
      local_28[1] = 0xff;
      local_28 = local_28 + 2;
    }
  }
  return;
}

Assistant:

static void mcmcliexp(mcmcxdef *cctx, mcmon clinum)
{
    /* add global number to client mapping table at client number */
    if (cctx->mcmcxmtb[clinum >> 8] == (mcmon *)0)
    {
        mcmcx1def *ctx = cctx->mcmcxgl;
        int        i;
        mcmon     *p;
        
        /* this page is not allocated - allocate it */
        p = (mcmon *)mchalo(ctx->mcmcxerr, (256 * sizeof(mcmon)),
                            "client mapping page");
        cctx->mcmcxmtb[clinum >> 8] = p;
        for (i = 0 ; i < 256 ; ++i) *p++ = MCMONINV;
    }
}